

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O1

void transform_info_imp(transform_display *dp,png_structp pp,png_infop pi)

{
  byte bVar1;
  undefined2 uVar2;
  png_byte pVar3;
  byte bVar4;
  size_t sVar5;
  char *pcVar6;
  int iVar7;
  image_pixel test_pixel;
  char message [128];
  image_pixel local_108;
  char local_a8 [136];
  
  standard_info_part1(&dp->this,pp,pi);
  (*dp->transform_list->set)(dp->transform_list,dp,pp,pi);
  iVar7 = (dp->this).use_update_info + 1;
  do {
    png_read_update_info(pp,pi);
    iVar7 = iVar7 + -1;
  } while (1 < iVar7);
  standard_info_part2(&dp->this,pp,pi,1);
  pVar3 = png_get_color_type(pp,pi);
  dp->output_colour_type = pVar3;
  bVar4 = png_get_bit_depth(pp,pi);
  dp->output_bit_depth = bVar4;
  if (((7 < bVar4) && ((dp->output_colour_type & 0xfd) == 0)) && ((dp->this).filler != '\0')) {
    dp->output_colour_type = dp->output_colour_type | 4;
  }
  bVar1 = dp->output_colour_type;
  if (bVar1 == 0) {
LAB_0010ff48:
    if ((0x10 < bVar4) || ((0x10116U >> (bVar4 & 0x1f) & 1) == 0)) {
LAB_00110146:
      sVar5 = safecat(local_a8,0x80,0,"invalid final bit depth: colour type(");
      sVar5 = safecatn(local_a8,0x80,sVar5,(uint)bVar1);
      sVar5 = safecat(local_a8,0x80,sVar5,") with bit depth: ");
      safecatn(local_a8,0x80,sVar5,(uint)dp->output_bit_depth);
      png_error(pp,local_a8);
    }
  }
  else {
    if (bVar1 == 3) {
      if (8 < bVar4) goto LAB_00110146;
      goto LAB_0010ff48;
    }
    if ((bVar4 != 8) && (bVar4 != 0x10)) goto LAB_00110146;
  }
  local_108.alphae = 0.0;
  local_108.greene = 0.0;
  local_108.bluee = 0.0;
  local_108.alphaf = 0.0;
  local_108.rede = 0.0;
  local_108.greenf = 0.0;
  local_108.bluef = 0.0;
  local_108.redf = 0.0;
  local_108.red = 0;
  local_108.green = 0;
  local_108.blue = 0;
  local_108.alpha = 0;
  uVar2._0_1_ = (dp->this).colour_type;
  uVar2._1_1_ = (dp->this).bit_depth;
  local_108.alpha_sBIT = '\b';
  if ((dp->this).colour_type != '\x03') {
    local_108.alpha_sBIT = (dp->this).bit_depth;
  }
  local_108._16_8_ =
       (ulong)CONCAT13((dp->this).is_transparent != 0,CONCAT12(local_108.alpha_sBIT,uVar2)) << 0x20;
  local_108.blue_sBIT = local_108.alpha_sBIT;
  local_108.green_sBIT = local_108.alpha_sBIT;
  local_108.red_sBIT = local_108.alpha_sBIT;
  local_108._92_4_ = 0;
  (*dp->transform_list->mod)(dp->transform_list,&local_108,pp,dp);
  bVar4 = dp->output_colour_type;
  if (local_108.colour_type == bVar4) {
    bVar4 = dp->output_bit_depth;
    if (local_108.bit_depth == bVar4) {
      if (local_108.sample_depth != 8 && local_108.colour_type == 3) {
        pcVar6 = "pngvalid: internal: palette sample depth not 8";
LAB_001100da:
        png_error(pp,pcVar6);
      }
      if (local_108.bit_depth != 8 && dp->unpacked != '\0') {
        pcVar6 = "pngvalid: internal: bad unpacked pixel depth";
        goto LAB_001100da;
      }
      if ((local_108.colour_type == 3 || dp->unpacked != '\0') ||
          local_108.bit_depth == local_108.sample_depth) {
        return;
      }
      pcVar6 = "internal: sample depth ";
      bVar4 = local_108.sample_depth;
    }
    else {
      pcVar6 = "bit depth ";
    }
    sVar5 = safecat(local_a8,0x80,0,pcVar6);
    sVar5 = safecatn(local_a8,0x80,sVar5,(uint)bVar4);
    sVar5 = safecat(local_a8,0x80,sVar5," expected ");
    bVar4 = local_108.bit_depth;
  }
  else {
    sVar5 = safecat(local_a8,0x80,0,"colour type ");
    sVar5 = safecatn(local_a8,0x80,sVar5,(uint)bVar4);
    sVar5 = safecat(local_a8,0x80,sVar5," expected ");
    bVar4 = local_108.colour_type;
  }
  safecatn(local_a8,0x80,sVar5,(uint)bVar4);
  png_error(pp,local_a8);
}

Assistant:

static void
transform_info_imp(transform_display *dp, png_structp pp, png_infop pi)
{
   /* Reuse the standard stuff as appropriate. */
   standard_info_part1(&dp->this, pp, pi);

   /* Now set the list of transforms. */
   dp->transform_list->set(dp->transform_list, dp, pp, pi);

   /* Update the info structure for these transforms: */
   {
      int i = dp->this.use_update_info;
      /* Always do one call, even if use_update_info is 0. */
      do
         png_read_update_info(pp, pi);
      while (--i > 0);
   }

   /* And get the output information into the standard_display */
   standard_info_part2(&dp->this, pp, pi, 1/*images*/);

   /* Plus the extra stuff we need for the transform tests: */
   dp->output_colour_type = png_get_color_type(pp, pi);
   dp->output_bit_depth = png_get_bit_depth(pp, pi);

   /* If png_set_filler is in action then fake the output color type to include
    * an alpha channel where appropriate.
    */
   if (dp->output_bit_depth >= 8 &&
       (dp->output_colour_type == PNG_COLOR_TYPE_RGB ||
        dp->output_colour_type == PNG_COLOR_TYPE_GRAY) && dp->this.filler)
       dp->output_colour_type |= 4;

   /* Validate the combination of colour type and bit depth that we are getting
    * out of libpng; the semantics of something not in the PNG spec are, at
    * best, unclear.
    */
   switch (dp->output_colour_type)
   {
   case PNG_COLOR_TYPE_PALETTE:
      if (dp->output_bit_depth > 8) goto error;
      /* FALLTHROUGH */
   case PNG_COLOR_TYPE_GRAY:
      if (dp->output_bit_depth == 1 || dp->output_bit_depth == 2 ||
         dp->output_bit_depth == 4)
         break;
      /* FALLTHROUGH */
   default:
      if (dp->output_bit_depth == 8 || dp->output_bit_depth == 16)
         break;
      /* FALLTHROUGH */
   error:
      {
         char message[128];
         size_t pos;

         pos = safecat(message, sizeof message, 0,
            "invalid final bit depth: colour type(");
         pos = safecatn(message, sizeof message, pos, dp->output_colour_type);
         pos = safecat(message, sizeof message, pos, ") with bit depth: ");
         pos = safecatn(message, sizeof message, pos, dp->output_bit_depth);

         png_error(pp, message);
      }
   }

   /* Use a test pixel to check that the output agrees with what we expect -
    * this avoids running the whole test if the output is unexpected.  This also
    * checks for internal errors.
    */
   {
      image_pixel test_pixel;

      memset(&test_pixel, 0, sizeof test_pixel);
      test_pixel.colour_type = dp->this.colour_type; /* input */
      test_pixel.bit_depth = dp->this.bit_depth;
      if (test_pixel.colour_type == PNG_COLOR_TYPE_PALETTE)
         test_pixel.sample_depth = 8;
      else
         test_pixel.sample_depth = test_pixel.bit_depth;
      /* Don't need sBIT here, but it must be set to non-zero to avoid
       * arithmetic overflows.
       */
      test_pixel.have_tRNS = dp->this.is_transparent != 0;
      test_pixel.red_sBIT = test_pixel.green_sBIT = test_pixel.blue_sBIT =
         test_pixel.alpha_sBIT = test_pixel.sample_depth;

      dp->transform_list->mod(dp->transform_list, &test_pixel, pp, dp);

      if (test_pixel.colour_type != dp->output_colour_type)
      {
         char message[128];
         size_t pos = safecat(message, sizeof message, 0, "colour type ");

         pos = safecatn(message, sizeof message, pos, dp->output_colour_type);
         pos = safecat(message, sizeof message, pos, " expected ");
         pos = safecatn(message, sizeof message, pos, test_pixel.colour_type);

         png_error(pp, message);
      }

      if (test_pixel.bit_depth != dp->output_bit_depth)
      {
         char message[128];
         size_t pos = safecat(message, sizeof message, 0, "bit depth ");

         pos = safecatn(message, sizeof message, pos, dp->output_bit_depth);
         pos = safecat(message, sizeof message, pos, " expected ");
         pos = safecatn(message, sizeof message, pos, test_pixel.bit_depth);

         png_error(pp, message);
      }

      /* If both bit depth and colour type are correct check the sample depth.
       */
      if (test_pixel.colour_type == PNG_COLOR_TYPE_PALETTE &&
          test_pixel.sample_depth != 8) /* oops - internal error! */
         png_error(pp, "pngvalid: internal: palette sample depth not 8");
      else if (dp->unpacked && test_pixel.bit_depth != 8)
         png_error(pp, "pngvalid: internal: bad unpacked pixel depth");
      else if (!dp->unpacked && test_pixel.colour_type != PNG_COLOR_TYPE_PALETTE
              && test_pixel.bit_depth != test_pixel.sample_depth)
      {
         char message[128];
         size_t pos = safecat(message, sizeof message, 0,
            "internal: sample depth ");

         /* Because unless something has set 'unpacked' or the image is palette
          * mapped we expect the transform to keep sample depth and bit depth
          * the same.
          */
         pos = safecatn(message, sizeof message, pos, test_pixel.sample_depth);
         pos = safecat(message, sizeof message, pos, " expected ");
         pos = safecatn(message, sizeof message, pos, test_pixel.bit_depth);

         png_error(pp, message);
      }
      else if (test_pixel.bit_depth != dp->output_bit_depth)
      {
         /* This could be a libpng error too; libpng has not produced what we
          * expect for the output bit depth.
          */
         char message[128];
         size_t pos = safecat(message, sizeof message, 0,
            "internal: bit depth ");

         pos = safecatn(message, sizeof message, pos, dp->output_bit_depth);
         pos = safecat(message, sizeof message, pos, " expected ");
         pos = safecatn(message, sizeof message, pos, test_pixel.bit_depth);

         png_error(pp, message);
      }
   }
}